

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_perl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  out)

{
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_00;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_01;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_02;
  transform_op tVar1;
  traits<char> *ptVar2;
  transform_op tVar3;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  tmp;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  traits<char> *ptStack_70;
  transform_op local_68;
  transform_op tStack_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  traits<char> *ptStack_58;
  transform_op local_50;
  transform_op tStack_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  traits<char> *ptStack_40;
  transform_op local_38;
  transform_op tStack_34;
  
  if (cur._M_current != end._M_current) {
    ptVar2 = *(traits<char> **)(this + 0x80);
    tVar3 = op_none;
    tVar1 = op_none;
    do {
      if (*cur._M_current == '\\') {
        local_98._M_current = cur._M_current + 1;
        if ((local_98._M_current == end._M_current) || (*local_98._M_current != 'g')) {
          out_02.rest_ = tVar3;
          out_02.next_ = tVar1;
          out_02.traits_ = ptVar2;
          out_02.out_.container = out.container;
          local_78 = out.container;
          ptStack_70 = ptVar2;
          local_68 = tVar1;
          tStack_64 = tVar3;
          format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                    (&local_90,this,&local_98,end,out_02);
          ptVar2 = local_90.traits_;
          out.container = local_90.out_.container;
          tVar1 = local_90.next_;
          tVar3 = local_90.rest_;
        }
        else {
          local_98._M_current = cur._M_current + 2;
          out_01.rest_ = tVar3;
          out_01.next_ = tVar1;
          out_01.traits_ = ptVar2;
          out_01.out_.container = out.container;
          local_60 = out.container;
          ptStack_58 = ptVar2;
          local_50 = tVar1;
          tStack_4c = tVar3;
          format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                    (&local_90,this,&local_98,end,out_01);
          ptVar2 = local_90.traits_;
          out.container = local_90.out_.container;
          tVar1 = local_90.next_;
          tVar3 = local_90.rest_;
        }
      }
      else if (*cur._M_current == '$') {
        local_98._M_current = cur._M_current + 1;
        out_00.rest_ = tVar3;
        out_00.next_ = tVar1;
        out_00.traits_ = ptVar2;
        out_00.out_.container = out.container;
        local_48 = out.container;
        ptStack_40 = ptVar2;
        local_38 = tVar1;
        tStack_34 = tVar3;
        format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                  (&local_90,this,&local_98,end,out_00);
        ptVar2 = local_90.traits_;
        out.container = local_90.out_.container;
        tVar1 = local_90.next_;
        tVar3 = local_90.rest_;
      }
      else {
        local_98._M_current = cur._M_current + 1;
        local_90.out_.container = out.container;
        local_90.traits_ = ptVar2;
        local_90.next_ = tVar1;
        local_90.rest_ = tVar3;
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=(&local_90,*cur._M_current);
        tVar1 = op_none;
      }
      cur._M_current = local_98._M_current;
    } while (local_98._M_current != end._M_current);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator format_perl_(ForwardIterator cur, ForwardIterator end, OutputIterator out) const
    {
        detail::case_converting_iterator<OutputIterator, char_type> iout(out, this->traits_.get());

        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                iout = this->format_backref_(++cur, end, iout);
                break;

            case BOOST_XPR_CHAR_(char_type, '\\'):
                if(++cur != end && BOOST_XPR_CHAR_(char_type, 'g') == *cur)
                {
                    iout = this->format_named_backref_(++cur, end, iout);
                }
                else
                {
                    iout = this->format_escape_(cur, end, iout);
                }
                break;

            default:
                *iout++ = *cur++;
                break;
            }
        }

        return iout.base();
    }